

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O2

bool __thiscall
cmInstallCommand::HandleFilesMode
          (cmInstallCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *pcVar1;
  bool programs;
  bool bVar2;
  PolicyStatus PVar3;
  ostream *poVar4;
  string *psVar5;
  size_type sVar6;
  cmGlobalGenerator *pcVar7;
  cmInstallFilesGenerator *g;
  PolicyID id;
  char *pcVar8;
  MessageType t;
  pointer filename;
  string destination;
  string type;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unknownArgs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  absFiles;
  string local_7a0;
  cmCAStringVector files;
  string local_708;
  ostringstream e;
  cmInstallCommandArguments ica;
  
  programs = std::operator==((args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start,"PROGRAMS");
  std::__cxx11::string::string((string *)&local_708,(string *)&this->DefaultComponentName);
  cmInstallCommandArguments::cmInstallCommandArguments(&ica,&local_708);
  std::__cxx11::string::~string((string *)&local_708);
  pcVar8 = "FILES";
  if (programs) {
    pcVar8 = "PROGRAMS";
  }
  cmCAStringVector::cmCAStringVector(&files,&ica.Parser,pcVar8,(cmCommandArgumentGroup *)0x0);
  cmCommandArgument::Follows(&files.super_cmCommandArgument,(cmCommandArgument *)0x0);
  cmCommandArgumentGroup::Follows(&ica.ArgumentGroup,&files.super_cmCommandArgument);
  unknownArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unknownArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  unknownArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmInstallCommandArguments::Parse(&ica,args,&unknownArgs);
  if (unknownArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      unknownArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar4 = std::operator<<((ostream *)&e,
                             (string *)
                             (args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start);
    poVar4 = std::operator<<(poVar4," given unknown argument \"");
    poVar4 = std::operator<<(poVar4,(string *)
                                    unknownArgs.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
    std::operator<<(poVar4,"\".");
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&type);
    std::__cxx11::string::~string((string *)&type);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    bVar2 = false;
    goto LAB_002602b2;
  }
  psVar5 = cmInstallCommandArguments::GetType_abi_cxx11_(&ica);
  std::__cxx11::string::string((string *)&type,(string *)psVar5);
  if (type._M_string_length == 0) {
LAB_0025ff0c:
    if (files.Vector.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        files.Vector.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      bVar2 = true;
    }
    else {
      psVar5 = cmInstallCommandArguments::GetRename_abi_cxx11_(&ica);
      if ((psVar5->_M_string_length != 0) &&
         (0x20 < (ulong)((long)files.Vector.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)files.Vector.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start))) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar4 = std::operator<<((ostream *)&e,
                                 (string *)
                                 (args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start);
        std::operator<<(poVar4," given RENAME option with more than one file.");
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&destination);
        goto LAB_002601de;
      }
      absFiles.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      absFiles.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      absFiles.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      bVar2 = MakeFilesFullPath(this,(((args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                     _M_p,&files.Vector,&absFiles);
      if (bVar2) {
        PVar3 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0062,false);
        pcVar7 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
        for (filename = files.Vector.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            filename !=
            files.Vector.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish; filename = filename + 1) {
          bVar2 = cmGlobalGenerator::IsExportedTargetsFile(pcVar7,filename);
          if (bVar2) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
            bVar2 = true;
            pcVar8 = "may";
            t = FATAL_ERROR;
            if (PVar3 - NEW < 3) {
LAB_002600c8:
              poVar4 = std::operator<<((ostream *)&e,"The file\n  ");
              poVar4 = std::operator<<(poVar4,(string *)filename);
              poVar4 = std::operator<<(poVar4,"\nwas generated by the export() command.  It ");
              poVar4 = std::operator<<(poVar4,pcVar8);
              std::operator<<(poVar4,
                              " not be installed with the install() command.  Use the install(EXPORT) mechanism instead.  See the cmake-packages(7) manual for more.\n"
                             );
              pcVar1 = (this->super_cmCommand).Makefile;
              std::__cxx11::stringbuf::str();
              cmMakefile::IssueMessage(pcVar1,t,&destination);
              std::__cxx11::string::~string((string *)&destination);
              if (bVar2) goto LAB_0026028b;
            }
            else if (PVar3 == WARN) {
              cmPolicies::GetPolicyWarning_abi_cxx11_(&destination,(cmPolicies *)0x3e,id);
              poVar4 = std::operator<<((ostream *)&e,(string *)&destination);
              std::operator<<(poVar4,"\n");
              std::__cxx11::string::~string((string *)&destination);
              bVar2 = false;
              pcVar8 = "should";
              t = AUTHOR_WARNING;
              goto LAB_002600c8;
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
          }
        }
        bVar2 = cmInstallCommandArguments::Finalize(&ica);
        if (!bVar2) goto LAB_00260298;
        if (type._M_string_length != 0) {
          psVar5 = cmInstallCommandArguments::GetDestination_abi_cxx11_(&ica);
          if (psVar5->_M_string_length != 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
            poVar4 = std::operator<<((ostream *)&e,
                                     (string *)
                                     (args->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start);
            std::operator<<(poVar4,
                            " given both TYPE and DESTINATION arguments. You may only specify one.")
            ;
            std::__cxx11::stringbuf::str();
            cmCommand::SetError(&this->super_cmCommand,&destination);
            std::__cxx11::string::~string((string *)&destination);
LAB_0026028b:
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
            goto LAB_00260298;
          }
        }
        GetDestinationForType(&destination,this,&ica,&type);
        bVar2 = destination._M_string_length != 0;
        if (destination._M_string_length == 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          poVar4 = std::operator<<((ostream *)&e,
                                   (string *)
                                   (args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start);
          std::operator<<(poVar4," given no DESTINATION!");
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&local_7a0);
          std::__cxx11::string::~string((string *)&local_7a0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
        }
        else {
          pcVar1 = (this->super_cmCommand).Makefile;
          g = CreateInstallFilesGenerator(pcVar1,&absFiles,&ica,programs,&destination);
          cmMakefile::AddInstallGenerator(pcVar1,&g->super_cmInstallGenerator);
          pcVar7 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
          psVar5 = cmInstallCommandArguments::GetComponent_abi_cxx11_(&ica);
          cmGlobalGenerator::AddInstallComponent(pcVar7,psVar5);
        }
        std::__cxx11::string::~string((string *)&destination);
      }
      else {
LAB_00260298:
        bVar2 = false;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&absFiles);
    }
  }
  else {
    sVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&allowedTypes_abi_cxx11_,&type);
    if (sVar6 != 0) goto LAB_0025ff0c;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar4 = std::operator<<((ostream *)&e,
                             (string *)
                             (args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start);
    poVar4 = std::operator<<(poVar4," given non-type \"");
    poVar4 = std::operator<<(poVar4,(string *)&type);
    std::operator<<(poVar4,"\" with TYPE argument.");
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&destination);
LAB_002601de:
    std::__cxx11::string::~string((string *)&destination);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    bVar2 = false;
  }
  std::__cxx11::string::~string((string *)&type);
LAB_002602b2:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&unknownArgs);
  cmCAStringVector::~cmCAStringVector(&files);
  cmInstallCommandArguments::~cmInstallCommandArguments(&ica);
  return bVar2;
}

Assistant:

bool cmInstallCommand::HandleFilesMode(std::vector<std::string> const& args)
{
  // This is the FILES mode.
  bool programs = (args[0] == "PROGRAMS");
  cmInstallCommandArguments ica(this->DefaultComponentName);
  cmCAStringVector files(&ica.Parser, programs ? "PROGRAMS" : "FILES");
  files.Follows(nullptr);
  ica.ArgumentGroup.Follows(&files);
  std::vector<std::string> unknownArgs;
  ica.Parse(&args, &unknownArgs);

  if (!unknownArgs.empty()) {
    // Unknown argument.
    std::ostringstream e;
    e << args[0] << " given unknown argument \"" << unknownArgs[0] << "\".";
    this->SetError(e.str());
    return false;
  }

  std::string type = ica.GetType();
  if (!type.empty() && allowedTypes.count(type) == 0) {
    std::ostringstream e;
    e << args[0] << " given non-type \"" << type << "\" with TYPE argument.";
    this->SetError(e.str());
    return false;
  }

  const std::vector<std::string>& filesVector = files.GetVector();

  // Check if there is something to do.
  if (filesVector.empty()) {
    return true;
  }

  if (!ica.GetRename().empty() && filesVector.size() > 1) {
    // The rename option works only with one file.
    std::ostringstream e;
    e << args[0] << " given RENAME option with more than one file.";
    this->SetError(e.str());
    return false;
  }

  std::vector<std::string> absFiles;
  if (!this->MakeFilesFullPath(args[0].c_str(), filesVector, absFiles)) {
    return false;
  }

  cmPolicies::PolicyStatus status =
    this->Makefile->GetPolicyStatus(cmPolicies::CMP0062);

  cmGlobalGenerator* gg = this->Makefile->GetGlobalGenerator();
  for (std::string const& file : filesVector) {
    if (gg->IsExportedTargetsFile(file)) {
      const char* modal = nullptr;
      std::ostringstream e;
      MessageType messageType = MessageType::AUTHOR_WARNING;

      switch (status) {
        case cmPolicies::WARN:
          e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0062) << "\n";
          modal = "should";
        case cmPolicies::OLD:
          break;
        case cmPolicies::REQUIRED_IF_USED:
        case cmPolicies::REQUIRED_ALWAYS:
        case cmPolicies::NEW:
          modal = "may";
          messageType = MessageType::FATAL_ERROR;
      }
      if (modal) {
        e << "The file\n  " << file
          << "\nwas generated by the export() "
             "command.  It "
          << modal
          << " not be installed with the "
             "install() command.  Use the install(EXPORT) mechanism "
             "instead.  See the cmake-packages(7) manual for more.\n";
        this->Makefile->IssueMessage(messageType, e.str());
        if (messageType == MessageType::FATAL_ERROR) {
          return false;
        }
      }
    }
  }

  if (!ica.Finalize()) {
    return false;
  }

  if (!type.empty() && !ica.GetDestination().empty()) {
    std::ostringstream e;
    e << args[0]
      << " given both TYPE and DESTINATION arguments. You may only specify "
         "one.";
    this->SetError(e.str());
    return false;
  }

  std::string destination = this->GetDestinationForType(&ica, type);
  if (destination.empty()) {
    // A destination is required.
    std::ostringstream e;
    e << args[0] << " given no DESTINATION!";
    this->SetError(e.str());
    return false;
  }

  // Create the files install generator.
  this->Makefile->AddInstallGenerator(CreateInstallFilesGenerator(
    this->Makefile, absFiles, ica, programs, destination));

  // Tell the global generator about any installation component names
  // specified.
  this->Makefile->GetGlobalGenerator()->AddInstallComponent(
    ica.GetComponent());

  return true;
}